

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void __thiscall despot::DESPOT::BeliefUpdate(DESPOT *this,ACT_TYPE action,OBS_TYPE obs)

{
  Belief *pBVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  double start;
  OBS_TYPE obs_local;
  ACT_TYPE action_local;
  DESPOT *this_local;
  
  dVar5 = get_time_second();
  pBVar1 = (this->super_Solver).belief_;
  (*pBVar1->_vptr_Belief[3])(pBVar1,(ulong)(uint)action,obs);
  History::Add(&(this->super_Solver).history_,action,obs);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar3 = logging::stream(3);
    poVar4 = std::operator<<(&plVar3->super_ostream,
                             "[Solver::Update] Updated belief, history and root with action ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
    poVar4 = std::operator<<(poVar4,", observation ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,obs);
    poVar4 = std::operator<<(poVar4," in ");
    dVar6 = get_time_second();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6 - dVar5);
    poVar4 = std::operator<<(poVar4,"s");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DESPOT::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	double start = get_time_second();

	belief_->Update(action, obs);
	history_.Add(action, obs);

	//lower_bound_->belief(belief_);

	logi << "[Solver::Update] Updated belief, history and root with action "
		<< action << ", observation " << obs
		<< " in " << (get_time_second() - start) << "s" << endl;
}